

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InteractionManager.cpp
# Opt level: O0

void __thiscall
OpenMD::InteractionManager::doSelfCorrection(InteractionManager *this,SelfData *sdat)

{
  uint *puVar1;
  element_type *peVar2;
  int *in_RSI;
  long in_RDI;
  int *sHash;
  InteractionManager *in_stack_00000d00;
  
  if ((*(byte *)(in_RDI + 8) & 1) == 0) {
    initialize(in_stack_00000d00);
  }
  puVar1 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x128),(long)*in_RSI);
  if ((*puVar1 & 1) != 0) {
    peVar2 = std::
             __shared_ptr_access<OpenMD::Electrostatic,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<OpenMD::Electrostatic,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x294bb3);
    (*(peVar2->super_ElectrostaticInteraction).super_NonBondedInteraction._vptr_NonBondedInteraction
      [7])(peVar2,in_RSI);
  }
  return;
}

Assistant:

void InteractionManager::doSelfCorrection(SelfData& sdat) {
    if (!initialized_) initialize();

    int& sHash = sHash_[sdat.atid];

    if ((sHash & ELECTROSTATIC_INTERACTION) != 0) {
      electrostatic_->calcSelfCorrection(sdat);
    }

    // set<NonBondedInteraction*>::iterator it;
    //
    // for (it = interactions_[atid1][atid2].begin();
    //      it != interactions_[atid1][atid2].end(); ++it){
    //   if ((*it)->getFamily() == ELECTROSTATIC_FAMILY) {
    //     dynamic_cast<ElectrostaticInteraction*>(*it)->calcSelfCorrection(sdat);
    //   }
    // }

    return;
  }